

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int64_t quicly_get_first_timeout(quicly_conn_t *conn)

{
  uint64_t *puVar1;
  size_t *psVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  quicly_stream_t *pqVar7;
  long lVar8;
  ulong uVar9;
  
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    return (conn->egress).send_ack_at;
  }
  if ((((conn->egress).datagram_frame_payloads.count == 0) ||
      (conn->application == (st_quicly_application_space_t *)0x0)) ||
     ((conn->application->cipher).egress.key.aead == (ptls_aead_context_t *)0x0)) {
    uVar9 = 0xffffffffffffffff;
    if (((uint)(conn->super).remote.address_validation & 1) == 0) {
      uVar5 = (ulong)((conn->super).ctx)->pre_validation_amplification_limit *
              (conn->super).stats.num_bytes.received;
      puVar1 = &(conn->super).stats.num_bytes.sent;
      uVar9 = 0;
      if (*puVar1 <= uVar5) {
        uVar9 = uVar5 - *puVar1;
      }
    }
    uVar6 = (ulong)(conn->egress).cc.cwnd;
    psVar2 = &(conn->egress).loss.sentmap.bytes_in_flight;
    uVar5 = 0;
    if (*psVar2 <= uVar6) {
      uVar5 = uVar6 - *psVar2;
    }
    if (uVar9 <= uVar5) {
      uVar5 = uVar9;
    }
    if ((uVar5 == 0) ||
       ((((conn->egress).pending_flows == '\0' &&
         ((conn->egress).pending_streams.control.prev == &(conn->egress).pending_streams.control))
        && (iVar4 = scheduler_can_send(conn), iVar4 == 0)))) {
      lVar8 = (conn->idle_timeout).at;
      if (uVar9 == 0) {
        return lVar8;
      }
      lVar3 = (conn->egress).loss.alarm_at;
      if (lVar3 < lVar8) {
        if (((conn->handshake != (st_quicly_handshake_space_t *)0x0) &&
            (conn->application != (st_quicly_application_space_t *)0x0)) &&
           (((conn->super).local.bidi.next_stream_id & 1) != 0)) {
          pqVar7 = quicly_get_stream(conn,-3);
          if (pqVar7 == (quicly_stream_t *)0x0) {
            __assert_fail("stream != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xb38,"int is_point5rtt_with_no_handshake_data_to_send(quicly_conn_t *)")
            ;
          }
          if (((pqVar7->sendstate).pending.num_ranges == 0) &&
             (((pqVar7->sendstate).acked.ranges)->end == (pqVar7->sendstate).size_inflight))
          goto LAB_00119fe6;
        }
        lVar8 = lVar3;
      }
LAB_00119fe6:
      lVar3 = (conn->egress).send_ack_at;
      if (lVar8 <= lVar3) {
        return lVar8;
      }
      return lVar3;
    }
  }
  return 0;
}

Assistant:

int64_t quicly_get_first_timeout(quicly_conn_t *conn)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return conn->egress.send_ack_at;

    if (should_send_datagram_frame(conn))
        return 0;

    uint64_t amp_window = calc_amplification_limit_allowance(conn);

    if (calc_send_window(conn, 0, amp_window, 0) > 0) {
        if (conn->egress.pending_flows != 0)
            return 0;
        if (quicly_linklist_is_linked(&conn->egress.pending_streams.control))
            return 0;
        if (scheduler_can_send(conn))
            return 0;
    }

    /* if something can be sent, return the earliest timeout. Otherwise return the idle timeout. */
    int64_t at = conn->idle_timeout.at;
    if (amp_window > 0) {
        if (conn->egress.loss.alarm_at < at && !is_point5rtt_with_no_handshake_data_to_send(conn))
            at = conn->egress.loss.alarm_at;
        if (conn->egress.send_ack_at < at)
            at = conn->egress.send_ack_at;
    }

    return at;
}